

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_multi_simple_var
              (secp256k1_gej *r,secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,
              void *cbdata,size_t n_points)

{
  int iVar1;
  undefined8 in_RCX;
  code *in_RDX;
  ulong in_R8;
  secp256k1_gej *unaff_retaddr;
  secp256k1_scalar scalar;
  secp256k1_gej pointj;
  secp256k1_ge point;
  secp256k1_gej tmpj;
  size_t point_idx;
  secp256k1_scalar *in_stack_00000678;
  secp256k1_scalar *in_stack_00000680;
  secp256k1_gej *in_stack_00000688;
  secp256k1_gej *in_stack_00000690;
  secp256k1_ge *in_stack_fffffffffffffe48;
  secp256k1_gej *in_stack_fffffffffffffe50;
  undefined1 local_110 [216];
  ulong local_38;
  ulong local_30;
  undefined8 local_28;
  code *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  secp256k1_gej_set_infinity((secp256k1_gej *)0x11d81c);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x11d829);
  secp256k1_ecmult(in_stack_00000690,in_stack_00000688,in_stack_00000680,in_stack_00000678);
  local_38 = 0;
  while( true ) {
    if (local_30 <= local_38) {
      return 1;
    }
    iVar1 = (*local_20)(&stack0xfffffffffffffe50,local_110,local_38,local_28);
    if (iVar1 == 0) break;
    secp256k1_gej_set_ge(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    secp256k1_ecmult(in_stack_00000690,in_stack_00000688,in_stack_00000680,in_stack_00000678);
    secp256k1_gej_add_var
              ((secp256k1_gej *)scalar.d[1],(secp256k1_gej *)scalar.d[0],unaff_retaddr,
               (secp256k1_fe *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    local_38 = local_38 + 1;
  }
  return 0;
}

Assistant:

static int secp256k1_ecmult_multi_simple_var(secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points) {
    size_t point_idx;
    secp256k1_gej tmpj;

    secp256k1_gej_set_infinity(r);
    secp256k1_gej_set_infinity(&tmpj);
    /* r = inp_g_sc*G */
    secp256k1_ecmult(r, &tmpj, &secp256k1_scalar_zero, inp_g_sc);
    for (point_idx = 0; point_idx < n_points; point_idx++) {
        secp256k1_ge point;
        secp256k1_gej pointj;
        secp256k1_scalar scalar;
        if (!cb(&scalar, &point, point_idx, cbdata)) {
            return 0;
        }
        /* r += scalar*point */
        secp256k1_gej_set_ge(&pointj, &point);
        secp256k1_ecmult(&tmpj, &pointj, &scalar, NULL);
        secp256k1_gej_add_var(r, r, &tmpj, NULL);
    }
    return 1;
}